

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalNearTest(Fts3Expr *pExpr,int *pRc)

{
  bool bVar1;
  Fts3Phrase *local_70;
  Fts3Phrase *pPhrase_1;
  int nNear_1;
  int nNear;
  Fts3Phrase *pPhrase;
  char *pcStack_40;
  int nToken;
  char *aPoslist;
  char *aTmp;
  sqlite3_int64 nTmp;
  Fts3Expr *p;
  int *piStack_18;
  int res;
  int *pRc_local;
  Fts3Expr *pExpr_local;
  
  p._4_4_ = 1;
  if (((*pRc == 0) && (pExpr->eType == 1)) &&
     ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))) {
    aTmp = (char *)0x0;
    for (nTmp = (sqlite3_int64)pExpr; *(long *)(nTmp + 0x10) != 0;
        nTmp = *(sqlite3_int64 *)(nTmp + 0x10)) {
      aTmp = aTmp + *(int *)(*(long *)(*(long *)(nTmp + 0x18) + 0x20) + 0x30);
    }
    aTmp = aTmp + *(int *)(*(long *)(nTmp + 0x20) + 0x30);
    piStack_18 = pRc;
    pRc_local = &pExpr->eType;
    aPoslist = (char *)sqlite3_malloc64((long)aTmp * 2);
    if (aPoslist == (char *)0x0) {
      *piStack_18 = 7;
      p._4_4_ = 0;
    }
    else {
      pcStack_40 = *(char **)(*(long *)(nTmp + 0x20) + 0x28);
      pPhrase._4_4_ = *(undefined4 *)(*(long *)(nTmp + 0x20) + 0x50);
      nTmp = *(sqlite3_int64 *)(nTmp + 8);
      while( true ) {
        bVar1 = false;
        if ((p._4_4_ != 0) && (bVar1 = false, nTmp != 0)) {
          bVar1 = *(int *)nTmp == 1;
        }
        if (!bVar1) break;
        p._4_4_ = fts3EvalNearTrim(*(int *)(nTmp + 4),aPoslist,&stack0xffffffffffffffc0,
                                   (int *)((long)&pPhrase + 4),
                                   *(Fts3Phrase **)(*(long *)(nTmp + 0x18) + 0x20));
        nTmp = *(sqlite3_int64 *)(nTmp + 8);
      }
      pcStack_40 = *(char **)(*(long *)(*(long *)(pRc_local + 6) + 0x20) + 0x28);
      pPhrase._4_4_ = *(undefined4 *)(*(long *)(*(long *)(pRc_local + 6) + 0x20) + 0x50);
      for (nTmp = *(sqlite3_int64 *)(pRc_local + 4); nTmp != 0 && p._4_4_ != 0;
          nTmp = *(sqlite3_int64 *)(nTmp + 0x10)) {
        if (*(int *)nTmp == 1) {
          local_70 = *(Fts3Phrase **)(*(long *)(nTmp + 0x18) + 0x20);
        }
        else {
          local_70 = *(Fts3Phrase **)(nTmp + 0x20);
        }
        p._4_4_ = fts3EvalNearTrim(*(int *)(*(long *)(nTmp + 8) + 4),aPoslist,
                                   &stack0xffffffffffffffc0,(int *)((long)&pPhrase + 4),local_70);
      }
    }
    sqlite3_free(aPoslist);
  }
  return p._4_4_;
}

Assistant:

static int fts3EvalNearTest(Fts3Expr *pExpr, int *pRc){
  int res = 1;

  /* The following block runs if pExpr is the root of a NEAR query.
  ** For example, the query:
  **
  **         "w" NEAR "x" NEAR "y" NEAR "z"
  **
  ** which is represented in tree form as:
  **
  **                               |
  **                          +--NEAR--+      <-- root of NEAR query
  **                          |        |
  **                     +--NEAR--+   "z"
  **                     |        |
  **                +--NEAR--+   "y"
  **                |        |
  **               "w"      "x"
  **
  ** The right-hand child of a NEAR node is always a phrase. The 
  ** left-hand child may be either a phrase or a NEAR node. There are
  ** no exceptions to this - it's the way the parser in fts3_expr.c works.
  */
  if( *pRc==SQLITE_OK 
   && pExpr->eType==FTSQUERY_NEAR 
   && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
  ){
    Fts3Expr *p; 
    sqlite3_int64 nTmp = 0;       /* Bytes of temp space */
    char *aTmp;                   /* Temp space for PoslistNearMerge() */

    /* Allocate temporary working space. */
    for(p=pExpr; p->pLeft; p=p->pLeft){
      assert( p->pRight->pPhrase->doclist.nList>0 );
      nTmp += p->pRight->pPhrase->doclist.nList;
    }
    nTmp += p->pPhrase->doclist.nList;
    aTmp = sqlite3_malloc64(nTmp*2);
    if( !aTmp ){
      *pRc = SQLITE_NOMEM;
      res = 0;
    }else{
      char *aPoslist = p->pPhrase->doclist.pList;
      int nToken = p->pPhrase->nToken;

      for(p=p->pParent;res && p && p->eType==FTSQUERY_NEAR; p=p->pParent){
        Fts3Phrase *pPhrase = p->pRight->pPhrase;
        int nNear = p->nNear;
        res = fts3EvalNearTrim(nNear, aTmp, &aPoslist, &nToken, pPhrase);
      }

      aPoslist = pExpr->pRight->pPhrase->doclist.pList;
      nToken = pExpr->pRight->pPhrase->nToken;
      for(p=pExpr->pLeft; p && res; p=p->pLeft){
        int nNear;
        Fts3Phrase *pPhrase;
        assert( p->pParent && p->pParent->pLeft==p );
        nNear = p->pParent->nNear;
        pPhrase = (
            p->eType==FTSQUERY_NEAR ? p->pRight->pPhrase : p->pPhrase
        );
        res = fts3EvalNearTrim(nNear, aTmp, &aPoslist, &nToken, pPhrase);
      }
    }

    sqlite3_free(aTmp);
  }

  return res;
}